

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall
JetHead::Socket::processFileEvents(Socket *this,int fd,short events,jh_ptr_int_t private_data)

{
  SocketListener *pSVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int ret;
  socklen_t len;
  undefined4 local_20;
  socklen_t local_1c;
  
  if (((events & 4U) == 0) || (this->mConnectedAsync != true)) {
    if ((events & 1U) == 0) {
      bVar5 = false;
    }
    else {
      iVar4 = (*(this->super_SelectorListener)._vptr_SelectorListener[6])(this);
      bVar6 = true;
      bVar5 = iVar4 == 0;
      if (!bVar5) {
        if (iVar4 == -1) {
          jh_log_print(3,"virtual void JetHead::Socket::processFileEvents(int, short, jh_ptr_int_t)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                       ,0x1b6,"Failed to get number of bytes available");
        }
        pSVar1 = this->mListener;
        bVar6 = pSVar1 == (SocketListener *)0x0;
        if (!bVar6) {
          (**(code **)(*(long *)pSVar1 + 8))(pSVar1,this);
        }
        bVar5 = false;
      }
      if (!bVar6) {
        return;
      }
    }
    if (((events & 0x10U) != 0) || (bVar5)) {
      pSVar1 = this->mListener;
      if ((pSVar1 != (SocketListener *)0x0) &&
         (cVar2 = (**(code **)(*(long *)pSVar1 + 0x10))(pSVar1,this), cVar2 != '\0')) {
        return;
      }
      (*(this->super_SelectorListener)._vptr_SelectorListener[5])(this);
      return;
    }
  }
  else {
    this->mConnectedAsync = false;
    if (this->mSelector != (Selector *)0x0) {
      Selector::removeListener(this->mSelector,this->mFd,&this->super_SelectorListener);
      Selector::addListener(this->mSelector,this->mFd,1,&this->super_SelectorListener,0);
    }
    if (this->mListener == (SocketListener *)0x0) {
      jh_log_print(2,"virtual void JetHead::Socket::processFileEvents(int, short, jh_ptr_int_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x196,"Listener doesn\'t exist");
      return;
    }
    local_20 = 0;
    local_1c = 4;
    uVar3 = getsockopt(fd,1,4,&local_20,&local_1c);
    (*(code *)**(undefined8 **)this->mListener)(this->mListener,this,~uVar3 >> 0x1f);
  }
  return;
}

Assistant:

void Socket::processFileEvents( int fd, short events, jh_ptr_int_t private_data )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	LOG( "events %x", events );
	bool closeDetected = false;
	bool userHandled = false;
	
	// Generally, we are only going to be listening for POLLOUT in the
	// case of async connection on a TCP socket (someone called
	// connectAsync).  In that case, setConnected would add POLLOUT to
	// our event list, and when it becomes writable (connected) we'll
	// trigger this.
	if (events & POLLOUT)
	{
		// If we WERE actually connected with connectAsync, AND
		// haven't called our listener for that yet.
		if (mConnectedAsync)
		{
			// Don't notify anyone with a handleConnected again.
			mConnectedAsync = false;

			// If we have a selector (which I guess we do since we are
			// here), then tweak the flags we are interested in.
			if (mSelector != NULL)
			{
				mSelector->removeListener(mFd, this);
				mSelector->addListener(mFd, POLLIN, this);
			}		

			if (mListener == NULL)
			{
				LOG_WARN("Listener doesn't exist");
				return;
			}

			// Figure out whether the connect succeeded or failed (not
			// strictly sure it can fail, the docs are a bit unclear).
			socklen_t len;
			int ret = 0;
			len = sizeof(ret);
			int res = getsockopt(fd, SOL_SOCKET, SO_ERROR, &ret, &len);
			if (res < 0) {
				// Notify the listener and be done
				mListener->handleConnected(this, false);
				return;
			}

			// Notify the listener and be done
			mListener->handleConnected(this, true);
			return;
		}		
	}
	
	if (events & POLLIN)
	{
		int bytesAvail = getBytesAvailable();
		if (bytesAvail == 0)
		{
			closeDetected = true;
		}
		else
		{
			if (bytesAvail == -1)
				LOG_WARN_PERROR("Failed to get number of bytes available");
			
			if (mListener != NULL)
			{
				mListener->handleData(this);

				// We REALLY want to return here, in the case that the
				// user has called close on the socket.  Really, any
				// time that we hand off control to the listener, we
				// shouldn't assume that the socket is still valid or
				// registered with the selector.  

				// However, this isn't really a problem: if we give
				// them control and they close us, the return here is
				// great.  If they return control after consuming the
				// data, then the POLLHUP will still exist and the
				// next time through the poll we will come right back
				// here without POLLIN.  If they haven't consumed all
				// of the data, then we'll just loop until they do
				// (not our problem really.)
				return;
			}
		}
	}
	if (events & POLLHUP)
	{
		closeDetected = true;
	}
	
	
	// If we detected a close on the other end of a
	// connection based socket then inform the listener
	// and if needed close the socket
	if (closeDetected)
	{
		if (mListener != NULL)
			userHandled = mListener->handleClose(this);
		
		if (not userHandled)
			close();
	}
}